

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O2

uint lodepng_color_mode_copy(LodePNGColorMode *dest,LodePNGColorMode *source)

{
  uint uVar1;
  LodePNGColorType LVar2;
  uint uVar3;
  uint uVar4;
  uchar *puVar5;
  long lVar6;
  
  lodepng_palette_clear(dest);
  uVar4 = source->key_b;
  dest->key_g = source->key_g;
  dest->key_b = uVar4;
  LVar2 = source->colortype;
  uVar3 = source->bitdepth;
  puVar5 = source->palette;
  uVar4 = source->key_defined;
  uVar1 = source->key_r;
  dest->palettesize = source->palettesize;
  dest->key_defined = uVar4;
  dest->key_r = uVar1;
  dest->colortype = LVar2;
  dest->bitdepth = uVar3;
  dest->palette = puVar5;
  if (source->palette == (uchar *)0x0) {
    uVar4 = 0;
  }
  else {
    puVar5 = (uchar *)malloc(0x400);
    dest->palette = puVar5;
    if ((puVar5 == (uchar *)0x0) && (source->palettesize != 0)) {
      uVar4 = 0x53;
    }
    else {
      uVar4 = 0;
      for (lVar6 = 0; lVar6 != source->palettesize << 2; lVar6 = lVar6 + 1) {
        dest->palette[lVar6] = source->palette[lVar6];
      }
    }
  }
  return uVar4;
}

Assistant:

unsigned lodepng_color_mode_copy(LodePNGColorMode* dest, const LodePNGColorMode* source)
{
	size_t i;
	lodepng_color_mode_cleanup(dest);
	*dest = *source;
	if (source->palette)
	{
		dest->palette = (unsigned char*)lodepng_malloc(1024);
		if (!dest->palette && source->palettesize) return 83; /*alloc fail*/
		for (i = 0; i != source->palettesize * 4; ++i) dest->palette[i] = source->palette[i];
	}
	return 0;
}